

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_copyall(Terminal *term,int *clipboards,wchar_t n_clipboards)

{
  tree234 *screen;
  wchar_t wVar1;
  pos bottom;
  pos top;
  
  screen = term->screen;
  wVar1 = sblines(term);
  top.y = -wVar1;
  top.x = L'\0';
  wVar1 = find_last_nonempty_line(term,screen);
  bottom.x = term->cols;
  bottom.y = wVar1;
  clipme(term,top,bottom,false,true,clipboards,n_clipboards);
  return;
}

Assistant:

void term_copyall(Terminal *term, const int *clipboards, int n_clipboards)
{
    pos top;
    pos bottom;
    tree234 *screen = term->screen;
    top.y = -sblines(term);
    top.x = 0;
    bottom.y = find_last_nonempty_line(term, screen);
    bottom.x = term->cols;
    clipme(term, top, bottom, false, true, clipboards, n_clipboards);
}